

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O2

Surface * deqp::egl::readSurface(Surface *__return_storage_ptr__,Functions *gl,IVec2 *size)

{
  GLsizei GVar1;
  GLsizei GVar2;
  glReadPixelsFunc p_Var3;
  GLenum err;
  PixelBufferAccess local_50;
  
  tcu::Surface::Surface(__return_storage_ptr__,size->m_data[0],size->m_data[1]);
  p_Var3 = gl->readPixels;
  GVar1 = size->m_data[0];
  GVar2 = size->m_data[1];
  tcu::Surface::getAccess(&local_50,__return_storage_ptr__);
  (*p_Var3)(0,0,GVar1,GVar2,0x1908,0x1401,local_50.super_ConstPixelBufferAccess.m_data);
  err = (*gl->getError)();
  glu::checkError(err,"glReadPixels() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglResizeTests.cpp"
                  ,0x136);
  return __return_storage_ptr__;
}

Assistant:

Surface readSurface (const glw::Functions& gl, IVec2 size)
{
	Surface ret (size.x(), size.y());
	gl.readPixels(0, 0, size.x(), size.y(), GL_RGBA, GL_UNSIGNED_BYTE,
				  ret.getAccess().getDataPtr());

	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() failed");
	return ret;
}